

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O0

void __thiscall
WorkQueue<CMU462::WorkItem>::put_work(WorkQueue<CMU462::WorkItem> *this,WorkItem *item)

{
  mutex *in_RSI;
  value_type *in_RDI;
  vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_> *unaff_retaddr;
  
  std::mutex::lock(in_RSI);
  std::vector<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>::push_back(unaff_retaddr,in_RDI);
  std::mutex::unlock((mutex *)0x2580db);
  return;
}

Assistant:

void put_work(const T& item) {
    lock.lock();
    storage.push_back(item);
    lock.unlock();
  }